

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fraClaus.c
# Opt level: O3

void Fra_ClausSimInfoRecord(Clu_Man_t *p,int *pModel)

{
  uint uVar1;
  uint uVar2;
  Cnf_Dat_t *pCVar3;
  void *pvVar4;
  int iVar5;
  int iVar6;
  long lVar7;
  
  iVar6 = p->nCexes;
  iVar5 = p->nCexesAlloc;
  if (iVar6 == iVar5) {
    Fra_ClausSimInfoRealloc(p);
    iVar6 = p->nCexes;
    iVar5 = p->nCexesAlloc;
  }
  if (iVar5 <= iVar6) {
    __assert_fail("p->nCexes < p->nCexesAlloc",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/zfchu[P]abc/src/proof/fra/fraClaus.c"
                  ,0x409,"void Fra_ClausSimInfoRecord(Clu_Man_t *, int *)");
  }
  pCVar3 = p->pCnf;
  iVar5 = pCVar3->nVars;
  if (0 < iVar5) {
    lVar7 = 0;
    do {
      if (pModel[lVar7] == 1) {
        if (p->vCexes->nSize <= lVar7) {
          __assert_fail("i >= 0 && i < p->nSize",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/zfchu[P]abc/src/misc/vec/vecPtr.h"
                        ,0x184,"void *Vec_PtrEntry(Vec_Ptr_t *, int)");
        }
        pvVar4 = p->vCexes->pArray[lVar7];
        uVar1 = p->nCexes;
        uVar2 = *(uint *)((long)pvVar4 + (long)((int)uVar1 >> 5) * 4);
        if ((uVar2 >> (uVar1 & 0x1f) & 1) != 0) {
          __assert_fail("Abc_InfoHasBit( (unsigned *)Vec_PtrEntry(p->vCexes, i), p->nCexes ) == 0",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/zfchu[P]abc/src/proof/fra/fraClaus.c"
                        ,0x40e,"void Fra_ClausSimInfoRecord(Clu_Man_t *, int *)");
        }
        *(uint *)((long)pvVar4 + (long)((int)uVar1 >> 5) * 4) = 1 << ((byte)uVar1 & 0x1f) | uVar2;
        iVar5 = pCVar3->nVars;
      }
      lVar7 = lVar7 + 1;
    } while (lVar7 < iVar5);
    iVar6 = p->nCexes;
  }
  p->nCexes = iVar6 + 1;
  return;
}

Assistant:

void Fra_ClausSimInfoRecord( Clu_Man_t * p, int * pModel )
{
    int i;
    if ( p->nCexes == p->nCexesAlloc )
        Fra_ClausSimInfoRealloc( p );
    assert( p->nCexes < p->nCexesAlloc );
    for ( i = 0; i < p->pCnf->nVars; i++ )
    {
        if ( pModel[i] == l_True )
        {
            assert( Abc_InfoHasBit( (unsigned *)Vec_PtrEntry(p->vCexes, i), p->nCexes ) == 0 );
            Abc_InfoSetBit( (unsigned *)Vec_PtrEntry(p->vCexes, i), p->nCexes );
        }
    }
    p->nCexes++;
}